

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_struct_tuple_reader
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  reference pptVar6;
  string *psVar7;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  allocator local_139;
  string local_138;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_118
  ;
  t_field **local_110;
  int local_108;
  allocator local_101;
  int i;
  string local_e0;
  string local_c0;
  string local_a0;
  allocator local_69;
  string local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  t_field **local_40;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  int optional_count;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"@Override");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public void read(org.apache.thrift.protocol.TProtocol prot, ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar3));
  poVar5 = std::operator<<(poVar5," struct) throws org.apache.thrift.TException {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,
                           "org.apache.thrift.protocol.TTupleProtocol iprot = (org.apache.thrift.protocol.TTupleProtocol) prot;"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  fields._4_4_ = 0;
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_38);
  local_40 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_38._M_current = local_40;
  while( true ) {
    local_48._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_38,&local_48);
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    eVar4 = t_field::get_req(*pptVar6);
    if (eVar4 == T_OPTIONAL) {
LAB_003425b1:
      fields._4_4_ = fields._4_4_ + 1;
    }
    else {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      eVar4 = t_field::get_req(*pptVar6);
      if (eVar4 == T_OPT_IN_REQ_OUT) goto LAB_003425b1;
    }
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_38);
    eVar4 = t_field::get_req(*pptVar6);
    if (eVar4 == T_REQUIRED) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      ptVar1 = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"struct.",&local_69);
      generate_deserialize_field(this,out,ptVar1,&local_68,false);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"struct.set");
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
      std::__cxx11::string::string((string *)&local_c0,(string *)psVar7);
      get_cap_name(&local_a0,this,&local_c0);
      poVar5 = std::operator<<(poVar5,(string *)&local_a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i,"isSet",&local_101);
      get_cap_name(&local_e0,this,(string *)&i);
      poVar5 = std::operator<<(poVar5,(string *)&local_e0);
      poVar5 = std::operator<<(poVar5,"(true);");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_38);
  }
  if (0 < fields._4_4_) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"java.util.BitSet incoming = iprot.readBitSet(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fields._4_4_);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    local_108 = 0;
    local_110 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_38._M_current = local_110;
    while( true ) {
      local_118._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_38,&local_118);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      eVar4 = t_field::get_req(*pptVar6);
      if (eVar4 == T_OPTIONAL) {
LAB_00342944:
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"if (incoming.get(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_108);
        poVar5 = std::operator<<(poVar5,")) {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_up((t_generator *)this);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        ptVar1 = *pptVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_138,"struct.",&local_139);
        generate_deserialize_field(this,out,ptVar1,&local_138,false);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"struct.set");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
        std::__cxx11::string::string((string *)&local_180,(string *)psVar7);
        get_cap_name(&local_160,this,&local_180);
        poVar5 = std::operator<<(poVar5,(string *)&local_160);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,"isSet",&local_1c1);
        get_cap_name(&local_1a0,this,&local_1c0);
        poVar5 = std::operator<<(poVar5,(string *)&local_1a0);
        poVar5 = std::operator<<(poVar5,"(true);");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        local_108 = local_108 + 1;
      }
      else {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_38);
        eVar4 = t_field::get_req(*pptVar6);
        if (eVar4 == T_OPT_IN_REQ_OUT) goto LAB_00342944;
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_38);
    }
  }
  t_generator::indent_down((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_reader(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "public void read(org.apache.thrift.protocol.TProtocol prot, "
              << tstruct->get_name() << " struct) throws org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "org.apache.thrift.protocol.TTupleProtocol iprot = (org.apache.thrift.protocol.TTupleProtocol) prot;" << endl;
  int optional_count = 0;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_OPTIONAL
        || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
      optional_count++;
    }
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      generate_deserialize_field(out, (*f_iter), "struct.", false);
      indent(out) << "struct.set" << get_cap_name((*f_iter)->get_name()) << get_cap_name("isSet")
                  << "(true);" << endl;
    }
  }
  if (optional_count > 0) {
    indent(out) << "java.util.BitSet incoming = iprot.readBitSet(" << optional_count << ");" << endl;
    int i = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (incoming.get(" << i << ")) {" << endl;
        indent_up();
        generate_deserialize_field(out, (*f_iter), "struct.", false);
        indent(out) << "struct.set" << get_cap_name((*f_iter)->get_name()) << get_cap_name("isSet")
                    << "(true);" << endl;
        indent_down();
        indent(out) << "}" << endl;
        i++;
      }
    }
  }
  indent_down();
  indent(out) << "}" << endl;
}